

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void llvm::DWARFYAML::EmitDebugLoc(raw_ostream *OS,Data *DI)

{
  pointer pLVar1;
  uchar *puVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  ulong Size;
  uchar *puVar4;
  pointer pLVar5;
  undefined1 local_58 [8];
  Loc Loc;
  
  pLVar1 = (DI->Locs).
           super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar5 = (DI->Locs).
                super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>.
                _M_impl.super__Vector_impl_data._M_start; pLVar5 != pLVar1; pLVar5 = pLVar5 + 1) {
    DWARFYAML::Loc::Loc((Loc *)local_58,pLVar5);
    Size = (ulong)((DI->CompileUnits).
                   super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                   ._M_impl.super__Vector_impl_data._M_start)->AddrSize;
    writeVariableSizedInteger((long)(int)local_58._0_4_,Size,OS,DI->IsLittleEndian);
    writeVariableSizedInteger((long)(int)local_58._4_4_,Size,OS,DI->IsLittleEndian);
    if ((local_58._0_4_ != 0xffffffff) && (local_58._4_4_ != 0 || local_58._0_4_ != 0)) {
      writeInteger<unsigned_short>
                ((short)Loc.Location.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_ - (short)Loc.Start,OS,
                 DI->IsLittleEndian);
      puVar2 = (uchar *)CONCAT44(Loc.Location.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 Loc.Location.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
      uVar3 = extraout_RDX;
      for (puVar4 = (uchar *)CONCAT44(Loc.End,Loc.Start); puVar4 != puVar2; puVar4 = puVar4 + 1) {
        writeInteger<unsigned_char>(*puVar4,OS,SUB81(uVar3,0));
        uVar3 = extraout_RDX_00;
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&Loc);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugLoc(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Loc : DI.Locs) {
    auto AddrSize = DI.CompileUnits[0].AddrSize;  // XXX BINARYEN
    // FIXME: Loc.Start etc should probably not be 32-bit.
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.Start, AddrSize, OS, DI.IsLittleEndian);
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.End, AddrSize, OS, DI.IsLittleEndian);
    if (Loc.Start == 0 && Loc.End == 0) {
      // End of a list.
      continue;
    }
    if (Loc.Start != -1) {
      writeInteger((uint16_t)Loc.Location.size(), OS, DI.IsLittleEndian);
      for (auto x : Loc.Location) {
        writeInteger((uint8_t)x, OS, DI.IsLittleEndian);
      }
    }
  }
}